

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::FindBestWindowPosForPopupEx
                 (ImVec2 *ref_pos,ImVec2 *size,ImGuiDir *last_dir,ImRect *r_outer,ImRect *r_avoid,
                 ImGuiPopupPositionPolicy policy)

{
  float fVar1;
  undefined8 uVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  ImGuiDir *pIVar7;
  long lVar8;
  int *piVar9;
  uint uVar10;
  uint uVar11;
  ImVec2 IVar12;
  ImVec2 IVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar19;
  float fVar20;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  ImVec2 IVar25;
  float fStack_54;
  ImRect local_40;
  
  IVar25 = *size;
  fVar14 = (r_outer->Max).x;
  fVar19 = (r_outer->Max).y;
  IVar12.x = fVar14 - size->x;
  IVar12.y = fVar19 - size->y;
  IVar12 = ImClamp(ref_pos,&r_outer->Min,IVar12);
  iVar5 = *last_dir;
  if (policy == ImGuiPopupPositionPolicy_ComboBox) {
    piVar9 = (int *)(&DAT_00182380 + (ulong)(iVar5 != -1) * -4);
    for (lVar8 = -4 - (ulong)(iVar5 != -1); lVar8 != 0; lVar8 = lVar8 + 1) {
      piVar6 = piVar9;
      if (lVar8 == -5) {
        piVar6 = last_dir;
      }
      iVar5 = *piVar6;
      if ((lVar8 == -5) || (iVar5 != *last_dir)) {
        switch(iVar5) {
        case 0:
          fVar14 = (r_avoid->Max).x - size->x;
          fVar19 = (r_avoid->Max).y;
          break;
        case 1:
          fVar14 = (r_avoid->Min).x;
          fVar19 = (r_avoid->Min).y - size->y;
          break;
        case 2:
          uVar2 = *(undefined8 *)&(r_avoid->Min).y;
          fVar14 = (float)((ulong)uVar2 >> 0x20) - (*size).x;
          fVar19 = (float)uVar2 - (*size).y;
          break;
        case 3:
          fVar14 = (r_avoid->Min).x;
          fVar19 = (r_avoid->Max).y;
          break;
        default:
          fVar14 = 0.0;
          fVar19 = 0.0;
        }
        local_40.Max.x = (*size).x + fVar14;
        local_40.Max.y = (*size).y + fVar19;
        local_40.Min.x = fVar14;
        local_40.Min.y = fVar19;
        bVar4 = ImRect::Contains(r_outer,&local_40);
        if (bVar4) {
          *last_dir = iVar5;
          IVar25.y = fVar19;
          IVar25.x = fVar14;
          return IVar25;
        }
      }
      piVar9 = piVar9 + 1;
    }
    iVar5 = *last_dir;
    fVar14 = (r_outer->Max).x;
    fVar19 = (r_outer->Max).y;
    IVar25 = *size;
  }
  fVar1 = (r_avoid->Min).y;
  fVar16 = (r_avoid->Max).x;
  fStack_54 = (r_avoid->Max).y;
  fVar21 = (r_outer->Min).x;
  fVar22 = (r_outer->Min).y;
  fVar15 = IVar25.x;
  fVar20 = IVar25.y;
  lVar8 = -4 - (ulong)(iVar5 != -1);
  piVar9 = (int *)(&DAT_00186b60 + (ulong)(iVar5 != -1) * -4);
  do {
    if (lVar8 == 0) {
      *last_dir = -1;
      auVar17._0_4_ = (*ref_pos).x + fVar15;
      auVar17._4_4_ = (*ref_pos).y + fVar20;
      auVar17._8_8_ = 0;
      auVar18._4_4_ = fVar19;
      auVar18._0_4_ = fVar14;
      auVar18._8_8_ = 0;
      auVar18 = minps(auVar17,auVar18);
      fVar15 = auVar18._0_4_ - fVar15;
      fVar20 = auVar18._4_4_ - fVar20;
      uVar10 = -(uint)(fVar21 <= fVar15);
      uVar11 = -(uint)(fVar22 <= fVar20);
      return (ImVec2)(CONCAT44(~uVar11 & (uint)fVar22,~uVar10 & (uint)fVar21) |
                     CONCAT44((uint)fVar20 & uVar11,(uint)fVar15 & uVar10));
    }
    pIVar7 = last_dir;
    if (lVar8 != -5) {
      pIVar7 = piVar9;
    }
    iVar3 = *pIVar7;
    if ((lVar8 == -5) || (iVar3 != iVar5)) {
      fVar23 = (r_avoid->Min).x;
      if (iVar3 != 0) {
        fVar23 = fVar14;
      }
      fVar24 = fVar16;
      if (iVar3 != 1) {
        fVar24 = fVar21;
      }
      if (fVar15 <= fVar23 - fVar24) {
        fVar23 = fVar1;
        if (iVar3 != 2) {
          fVar23 = fVar19;
        }
        fVar24 = fStack_54;
        if (iVar3 != 3) {
          fVar24 = fVar22;
        }
        if (fVar20 <= fVar23 - fVar24) {
          if (iVar3 == 0) {
            fVar16 = (r_avoid->Min).x - fVar15;
          }
          else if (iVar3 != 1) {
            fVar16 = IVar12.x;
            if (iVar3 == 2) {
              fStack_54 = fVar1 - fVar20;
              goto LAB_001188d5;
            }
            if (iVar3 == 3) goto LAB_001188d5;
          }
          fStack_54 = IVar12.y;
LAB_001188d5:
          IVar13.y = fStack_54;
          IVar13.x = fVar16;
          *last_dir = iVar3;
          return IVar13;
        }
      }
    }
    lVar8 = lVar8 + 1;
    piVar9 = piVar9 + 1;
  } while( true );
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopupEx(const ImVec2& ref_pos, const ImVec2& size, ImGuiDir* last_dir, const ImRect& r_outer, const ImRect& r_avoid, ImGuiPopupPositionPolicy policy)
{
    ImVec2 base_pos_clamped = ImClamp(ref_pos, r_outer.Min, r_outer.Max - size);
    //GetForegroundDrawList()->AddRect(r_avoid.Min, r_avoid.Max, IM_COL32(255,0,0,255));
    //GetForegroundDrawList()->AddRect(r_outer.Min, r_outer.Max, IM_COL32(0,255,0,255));

    // Combo Box policy (we want a connecting edge)
    if (policy == ImGuiPopupPositionPolicy_ComboBox)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Down, ImGuiDir_Right, ImGuiDir_Left, ImGuiDir_Up };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;
            ImVec2 pos;
            if (dir == ImGuiDir_Down)  pos = ImVec2(r_avoid.Min.x, r_avoid.Max.y);          // Below, Toward Right (default)
            if (dir == ImGuiDir_Right) pos = ImVec2(r_avoid.Min.x, r_avoid.Min.y - size.y); // Above, Toward Right
            if (dir == ImGuiDir_Left)  pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Max.y); // Below, Toward Left
            if (dir == ImGuiDir_Up)    pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Min.y - size.y); // Above, Toward Left
            if (!r_outer.Contains(ImRect(pos, pos + size)))
                continue;
            *last_dir = dir;
            return pos;
        }
    }

    // Default popup policy
    const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Right, ImGuiDir_Down, ImGuiDir_Up, ImGuiDir_Left };
    for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
    {
        const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
        if (n != -1 && dir == *last_dir) // Already tried this direction?
            continue;
        float avail_w = (dir == ImGuiDir_Left ? r_avoid.Min.x : r_outer.Max.x) - (dir == ImGuiDir_Right ? r_avoid.Max.x : r_outer.Min.x);
        float avail_h = (dir == ImGuiDir_Up ? r_avoid.Min.y : r_outer.Max.y) - (dir == ImGuiDir_Down ? r_avoid.Max.y : r_outer.Min.y);
        if (avail_w < size.x || avail_h < size.y)
            continue;
        ImVec2 pos;
        pos.x = (dir == ImGuiDir_Left) ? r_avoid.Min.x - size.x : (dir == ImGuiDir_Right) ? r_avoid.Max.x : base_pos_clamped.x;
        pos.y = (dir == ImGuiDir_Up)   ? r_avoid.Min.y - size.y : (dir == ImGuiDir_Down)  ? r_avoid.Max.y : base_pos_clamped.y;
        *last_dir = dir;
        return pos;
    }

    // Fallback, try to keep within display
    *last_dir = ImGuiDir_None;
    ImVec2 pos = ref_pos;
    pos.x = ImMax(ImMin(pos.x + size.x, r_outer.Max.x) - size.x, r_outer.Min.x);
    pos.y = ImMax(ImMin(pos.y + size.y, r_outer.Max.y) - size.y, r_outer.Min.y);
    return pos;
}